

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<$c3582d1e$>::grow
          (SmallVectorTemplateBase<_c3582d1e_> *this,size_t MinSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 *__ptr;
  undefined8 *puVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  void *pvVar8;
  long lVar9;
  
  pvVar3 = (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.BeginX;
  pvVar4 = (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.EndX;
  uVar7 = NextPowerOf2(((long)(this->super_SmallVectorTemplateCommon<_dd0a5239_>).
                              super_SmallVectorBase.CapacityX - (long)pvVar3) / 0x18 + 2);
  if (MinSize < uVar7) {
    MinSize = uVar7;
  }
  pvVar8 = malloc(MinSize * 0x18);
  __ptr = (undefined1 *)
          (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.BeginX;
  puVar5 = (undefined8 *)
           (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.EndX;
  for (lVar9 = 0; puVar1 = (undefined8 *)(__ptr + lVar9), puVar1 != puVar5; lVar9 = lVar9 + 0x18) {
    puVar2 = (undefined8 *)((long)pvVar8 + lVar9);
    puVar2[2] = puVar1[2];
    uVar6 = puVar1[1];
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
  }
  if ((U *)__ptr != &(this->super_SmallVectorTemplateCommon<_dd0a5239_>).FirstEl) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.EndX =
       (void *)(((long)pvVar4 - (long)pvVar3) + (long)pvVar8);
  (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.BeginX = pvVar8;
  (this->super_SmallVectorTemplateCommon<_dd0a5239_>).super_SmallVectorBase.CapacityX =
       (void *)(MinSize * 0x18 + (long)pvVar8);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}